

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Print.H
# Opt level: O0

void __thiscall amrex::Print::Print(Print *this,int rank_,ostream *os_)

{
  long lVar1;
  MPI_Comm MVar2;
  streamsize __prec;
  undefined8 in_RDX;
  undefined4 in_ESI;
  undefined4 *in_RDI;
  
  *in_RDI = in_ESI;
  MVar2 = ParallelContext::CommunicatorSub();
  in_RDI[1] = MVar2;
  *(undefined8 *)(in_RDI + 2) = in_RDX;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(in_RDI + 4));
  lVar1 = *(long *)(*(long *)(in_RDI + 4) + -0x18);
  __prec = std::ios_base::precision
                     ((ios_base *)
                      ((long)*(long **)(in_RDI + 2) + *(long *)(**(long **)(in_RDI + 2) + -0x18)));
  std::ios_base::precision((ios_base *)((long)in_RDI + lVar1 + 0x10),__prec);
  return;
}

Assistant:

Print (int rank_, std::ostream& os_ = amrex::OutStream())
            : rank(rank_)
            , comm(ParallelContext::CommunicatorSub())
            , os(os_)
            { ss.precision(os.precision()); }